

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_algebraic.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_88f01::ir_algebraic_visitor::handle_rvalue
          (ir_algebraic_visitor *this,ir_rvalue **rvalue)

{
  exec_node *peVar1;
  uint8_t uVar2;
  byte bVar3;
  ir_constant *ir1;
  ir_constant *piVar4;
  ir_constant *piVar5;
  long *plVar6;
  long lVar7;
  uint64_t uVar8;
  ir_instruction *piVar9;
  long lVar10;
  operand a;
  bool bVar11;
  long *plVar12;
  ir_rvalue **ppiVar13;
  char cVar14;
  int iVar15;
  int iVar16;
  operand oVar17;
  void *pvVar18;
  undefined4 extraout_var;
  ir_expression *piVar19;
  long lVar20;
  undefined4 extraout_var_00;
  ir_variable *piVar21;
  ir_assignment *piVar22;
  ir_swizzle *this_00;
  ir_swizzle *this_01;
  operand oVar23;
  ir_constant *extraout_RAX;
  ir_variable *this_02;
  long lVar24;
  ir_constant *extraout_RAX_00;
  ir_constant *piVar25;
  ir_rvalue *piVar26;
  ulong uVar27;
  uint64_t uVar28;
  glsl_type *pgVar29;
  int i;
  ulong uVar30;
  undefined8 *puVar31;
  operand *this_03;
  long lVar32;
  ir_expression_operation iVar33;
  ir_expression *in_R8;
  uint uVar34;
  ir_constant *unaff_R13;
  uint uVar35;
  undefined1 uVar36;
  bool bVar37;
  undefined4 uVar38;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  float fVar39;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar40;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ir_constant *op_const [4];
  ir_expression *op_expr [4];
  uint components [4];
  ir_constant *local_160;
  ir_constant *local_138;
  long *plStack_130;
  long *local_128;
  undefined8 uStack_120;
  ir_constant *local_118 [4];
  ulong local_f8;
  operand local_f0;
  operand local_e8;
  long local_e0;
  ir_rvalue **local_d8;
  operand local_d0;
  operand local_c8;
  operand local_c0;
  ir_constant_data local_b8;
  
  ir1 = (ir_constant *)*rvalue;
  if (ir1 == (ir_constant *)0x0) {
    return;
  }
  if ((ir1->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression) {
    return;
  }
  if ((ir1->value).u[0] == ir_last_opcode) {
    return;
  }
  local_d8 = rvalue;
  uVar38 = 0;
  uVar40 = 0;
  local_128 = (long *)0x0;
  uStack_120 = 0;
  local_138 = (ir_constant *)0x0;
  plStack_130 = (long *)0x0;
  local_118[2] = (ir_constant *)0x0;
  local_118[3] = (ir_constant *)0x0;
  local_118[0] = (ir_constant *)0x0;
  local_118[1] = (ir_constant *)0x0;
  if ((ir1->value).u[0] == ir_binop_mul) {
    piVar26 = (ir_rvalue *)(ir1->value).u64[1];
    if ((1 < piVar26->type->matrix_columns) && ((byte)piVar26->type->field_0x4 - 2 < 3)) {
      pgVar29 = ((ir_rvalue *)(ir1->value).u64[2])->type;
      if ((1 < pgVar29->vector_elements) &&
         ((pgVar29->matrix_columns == '\x01' && ((*(uint *)&pgVar29->field_0x4 & 0xfc) < 0xc)))) {
        bVar37 = true;
        if ((piVar26 != (ir_rvalue *)0x0) &&
           (((piVar26->super_ir_instruction).ir_type == ir_type_expression &&
            (*(int *)&piVar26[1].super_ir_instruction._vptr_ir_instruction == 0x73)))) {
          oVar23.val = (ir_rvalue *)piVar26[1].super_ir_instruction.super_exec_node.next;
          pgVar29 = (oVar23.val)->type;
          if ((1 < pgVar29->matrix_columns) && ((byte)pgVar29->field_0x4 - 2 < 3)) {
            oVar17.val = (ir_rvalue *)piVar26[1].super_ir_instruction.super_exec_node.prev;
            pgVar29 = (oVar17.val)->type;
            if ((1 < pgVar29->matrix_columns) && ((byte)pgVar29->field_0x4 - 2 < 3)) {
              oVar17.val = &ir_builder::mul(oVar17,(ir_rvalue *)(ir1->value).u64[2])->
                            super_ir_rvalue;
              unaff_R13 = (ir_constant *)ir_builder::mul(oVar23,oVar17);
              bVar37 = false;
              uVar38 = extraout_XMM0_Da;
              uVar40 = extraout_XMM0_Db;
            }
          }
        }
        local_160 = unaff_R13;
        if (!bVar37) goto LAB_0017e6b2;
      }
    }
  }
  if (4 < (ir1->value).b[0x28]) {
    __assert_fail("ir->num_operands <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                  ,0x14e,
                  "ir_rvalue *(anonymous namespace)::ir_algebraic_visitor::handle_expression(ir_expression *)"
                 );
  }
  bVar37 = (ir1->value).b[0x28] != false;
  piVar25 = unaff_R13;
  if (bVar37) {
    piVar26 = (ir_rvalue *)(ir1->value).u64[1];
    if ((piVar26->type->matrix_columns < 2) ||
       (bVar37 = true, piVar25 = ir1, 2 < (byte)piVar26->type->field_0x4 - 2)) {
      uVar30 = 0;
      do {
        pvVar18 = ralloc_parent(ir1);
        iVar15 = (*(piVar26->super_ir_instruction)._vptr_ir_instruction[6])(piVar26,pvVar18,0);
        (&local_138)[uVar30] = (ir_constant *)CONCAT44(extraout_var,iVar15);
        piVar25 = *(ir_constant **)((long)&ir1->value + uVar30 * 8 + 8);
        if ((piVar25->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression) {
          piVar25 = (ir_constant *)0x0;
        }
        local_118[uVar30] = piVar25;
        uVar27 = uVar30 + 1;
        bVar37 = uVar27 < (ir1->value).b[0x28];
        piVar25 = unaff_R13;
        uVar38 = extraout_XMM0_Da_00;
        uVar40 = extraout_XMM0_Db_00;
        if (!bVar37) break;
        piVar26 = *(ir_rvalue **)((long)&ir1->value + uVar30 * 8 + 0x10);
        uVar30 = uVar27;
      } while ((piVar26->type->matrix_columns < 2) ||
              (piVar25 = ir1, 2 < (byte)piVar26->type->field_0x4 - 2));
    }
  }
  local_160 = piVar25;
  if (bVar37) goto LAB_0017e6b2;
  if (this->mem_ctx == (void *)0x0) {
    pvVar18 = ralloc_parent(ir1);
    this->mem_ctx = pvVar18;
    uVar38 = extraout_XMM0_Da_01;
    uVar40 = extraout_XMM0_Db_01;
  }
  piVar5 = local_118[0];
  plVar12 = local_128;
  piVar4 = local_138;
  switch((ir1->value).u[0]) {
  case 0x5b:
    if ((local_118[0] != (ir_constant *)0x0) && ((local_118[0]->value).u[0] == 0x6c)) {
      uVar8 = (local_118[0]->value).u64[1];
      uVar28 = 0;
      if (*(int *)((local_118[0]->value).u64[2] + 0x18) == 4) {
        uVar28 = (local_118[0]->value).u64[2];
      }
      uVar36 = true;
      if ((((uVar8 == 0) || (*(int *)(uVar8 + 0x18) != 4)) || (uVar28 == 0)) ||
         ((*(int *)(uVar8 + 0x28) != 0x10 || (*(int *)(uVar28 + 0x28) != 0x10))))
      goto joined_r0x0017e6ad;
      oVar23.val = &ir_builder::logic_or
                              (*(ir_rvalue **)(uVar8 + 0x30),*(ir_rvalue **)(uVar28 + 0x30))->
                    super_ir_rvalue;
      piVar25 = (ir_constant *)ir_builder::b2f(oVar23);
LAB_0017db6f:
      uVar36 = false;
      goto joined_r0x0017e6ad;
    }
    break;
  case 0x5c:
    piVar26 = (ir_rvalue *)(ir1->value).u64[1];
    uVar36 = true;
    if (((piVar26 != (ir_rvalue *)0x0) &&
        ((piVar26->super_ir_instruction).ir_type == ir_type_expression)) &&
       (*(int *)&piVar26[1].super_ir_instruction._vptr_ir_instruction == 0x5d)) {
LAB_0017db6b:
      piVar25 = (ir_constant *)piVar26[1].super_ir_instruction.super_exec_node.next;
      goto LAB_0017db6f;
    }
    goto joined_r0x0017e6ad;
  case 0x5d:
    piVar26 = (ir_rvalue *)(ir1->value).u64[1];
    uVar36 = true;
    if (((piVar26 != (ir_rvalue *)0x0) &&
        ((piVar26->super_ir_instruction).ir_type == ir_type_expression)) &&
       (*(int *)&piVar26[1].super_ir_instruction._vptr_ir_instruction == 0x5c)) goto LAB_0017db6b;
    goto joined_r0x0017e6ad;
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x66:
  case 0x67:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x91:
    break;
  case 0x65:
  case 0x8f:
  case 0x90:
    if (local_138 != (ir_constant *)0x0) goto LAB_0017e1b0;
    break;
  case 0x68:
    piVar26 = (ir_rvalue *)(ir1->value).u64[1];
    uVar36 = true;
    if (((piVar26 != (ir_rvalue *)0x0) &&
        ((piVar26->super_ir_instruction).ir_type == ir_type_expression)) &&
       (*(int *)&piVar26[1].super_ir_instruction._vptr_ir_instruction == 0x6a)) goto LAB_0017db6b;
    goto joined_r0x0017e6ad;
  case 0x69:
    piVar26 = (ir_rvalue *)(ir1->value).u64[1];
    uVar36 = true;
    if (((piVar26 != (ir_rvalue *)0x0) &&
        ((piVar26->super_ir_instruction).ir_type == ir_type_expression)) &&
       (*(int *)&piVar26[1].super_ir_instruction._vptr_ir_instruction == 0x6b)) goto LAB_0017db6b;
    goto joined_r0x0017e6ad;
  case 0x6a:
    piVar26 = (ir_rvalue *)(ir1->value).u64[1];
    uVar36 = true;
    if (((piVar26 != (ir_rvalue *)0x0) &&
        ((piVar26->super_ir_instruction).ir_type == ir_type_expression)) &&
       (*(int *)&piVar26[1].super_ir_instruction._vptr_ir_instruction == 0x68)) goto LAB_0017db6b;
    goto joined_r0x0017e6ad;
  case 0x6b:
    piVar26 = (ir_rvalue *)(ir1->value).u64[1];
    uVar36 = true;
    if (((piVar26 != (ir_rvalue *)0x0) &&
        ((piVar26->super_ir_instruction).ir_type == ir_type_expression)) &&
       (*(int *)&piVar26[1].super_ir_instruction._vptr_ir_instruction == 0x69)) goto LAB_0017db6b;
    goto joined_r0x0017e6ad;
  case 0x6c:
    if ((local_138 != (ir_constant *)0x0) &&
       (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (local_138), (char)iVar15 != '\0')) {
LAB_0017db9e:
      local_160 = (ir_constant *)(ir1->value).u64[2];
      goto LAB_0017e6b2;
    }
    plVar12 = plStack_130;
    if ((plStack_130 != (long *)0x0) &&
       (cVar14 = (**(code **)(*plStack_130 + 0x50))(plStack_130), cVar14 != '\0'))
    goto LAB_0017e1b0;
    uVar30 = 0;
    bVar37 = false;
    do {
      piVar5 = local_118[uVar30];
      if ((piVar5 != (ir_constant *)0x0) && ((piVar5->value).u[0] == 2)) {
        lVar20 = *(long *)((long)&ir1->value + (uVar30 ^ 1) * 8 + 8);
        bVar11 = true;
        if ((lVar20 != 0) &&
           (plVar6 = *(long **)((long)&piVar5->value + 8),
           cVar14 = (**(code **)(*plVar6 + 0x28))(plVar6,lVar20,0x17), cVar14 != '\0')) {
          piVar25 = ir_constant::zero(ir1,(ir1->super_ir_rvalue).type);
          bVar11 = false;
        }
        if (!bVar11) break;
      }
      uVar30 = uVar30 + 1;
      bVar37 = uVar30 != 1;
    } while (uVar30 == 1);
    local_160 = piVar25;
    if (!bVar37) goto LAB_0017e6b2;
    if (plVar12 == (long *)0x0 && piVar4 != (ir_constant *)0x0) {
      reassociate_constant(this,(ir_expression *)ir1,0,local_118[1],in_R8);
    }
    if (piVar4 == (ir_constant *)0x0 && plVar12 != (long *)0x0) {
      reassociate_constant(this,(ir_expression *)ir1,1,local_118[0],in_R8);
    }
    if ((this->options->OptimizeForAOS != '\0') &&
       (local_160 = (ir_constant *)
                    try_replace_with_dot
                              ((ir_expression *)local_118[0],(ir_expression *)local_118[1],
                               this->mem_ctx), local_160 != (ir_constant *)0x0)) goto LAB_0017e6b2;
    lVar20 = 0;
    local_160 = piVar25;
    do {
      piVar25 = local_118[lVar20];
      uVar35 = 0x10;
      if ((piVar25 != (ir_constant *)0x0) && ((piVar25->value).u[0] == 0x73)) {
        lVar32 = 1 - lVar20;
        local_e0 = lVar20;
        lVar24 = 0;
        do {
          lVar10 = *(long *)((long)&piVar25->value + lVar24 * 8 + 8);
          uVar35 = 0x13;
          if (((lVar10 != 0) && (*(int *)(lVar10 + 0x18) == 4)) && (*(int *)(lVar10 + 0x28) == 0x6c)
             ) {
            local_f8 = 1 - lVar24;
            lVar20 = -8;
            puVar31 = (undefined8 *)(lVar10 + 0x38);
            do {
              lVar7 = *(long *)(lVar10 + 0x38 + lVar20);
              uVar35 = 0x16;
              bVar37 = true;
              if (((lVar7 != 0) && (*(int *)(lVar7 + 0x18) == 4)) && (*(int *)(lVar7 + 0x28) == 2))
              {
                oVar23.val = *(ir_rvalue **)((long)ir1 + lVar32 * 8 + 0x30);
                cVar14 = (**(code **)(**(long **)(lVar7 + 0x30) + 0x28))
                                   (*(long **)(lVar7 + 0x30),oVar23.val,0x17);
                if (cVar14 == '\0') {
                  uVar35 = 0x16;
                }
                else {
                  pgVar29 = (oVar23.val)->type;
                  uVar35 = 0x16;
                  if ((((byte)pgVar29->field_0x4 - 2 < 3) &&
                      (pgVar29 == ((ir_rvalue *)*puVar31)->type)) &&
                     (oVar17.val = *(ir_rvalue **)((long)&piVar25->value + local_f8 * 8 + 8),
                     pgVar29 == (oVar17.val)->type)) {
                    local_160 = (ir_constant *)ir_builder::lrp(oVar23,(ir_rvalue *)*puVar31,oVar17);
                    uVar35 = 1;
                    bVar37 = false;
                  }
                }
              }
              if (!bVar37) goto LAB_0017d94b;
              puVar31 = puVar31 + -1;
              lVar20 = lVar20 + 8;
            } while (lVar20 == 0);
            uVar35 = 0x14;
LAB_0017d94b:
            lVar20 = local_e0;
            if (uVar35 == 0x14) {
              uVar35 = 0;
            }
          }
          if ((uVar35 != 0x13) && (uVar35 != 0)) goto LAB_0017d990;
          bVar37 = lVar24 == 0;
          lVar24 = lVar24 + 1;
        } while (bVar37);
        uVar35 = 0x11;
LAB_0017d990:
        if (uVar35 == 0x11) {
          uVar35 = 0;
        }
      }
      if ((uVar35 & 0xf) != 0) goto LAB_0017d9b6;
      bVar37 = lVar20 == 0;
      lVar20 = lVar20 + 1;
    } while (bVar37);
    uVar35 = 0xe;
LAB_0017d9b6:
    if (uVar35 != 0xe) goto LAB_0017e6b2;
    break;
  case 0x6d:
    if ((local_138 != (ir_constant *)0x0) &&
       (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(),
       (char)iVar15 != '\0')) {
LAB_0017d6a3:
      oVar23.val = (ir_rvalue *)(ir1->value).d[2];
LAB_0017d6a7:
      local_160 = (ir_constant *)ir_builder::neg(oVar23);
      goto LAB_0017e6b2;
    }
LAB_0017d6b1:
    if (plStack_130 != (long *)0x0) {
      cVar14 = (**(code **)(*plStack_130 + 0x50))();
      goto LAB_0017e1a8;
    }
    break;
  case 0x73:
    if ((local_138 != (ir_constant *)0x0) &&
       (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (local_138), (char)iVar15 != '\0')) goto LAB_0017db9e;
    plVar12 = plStack_130;
    if ((plStack_130 != (long *)0x0) &&
       (cVar14 = (**(code **)(*plStack_130 + 0x58))(plStack_130), cVar14 != '\0'))
    goto LAB_0017e1b0;
    if (((piVar4 == (ir_constant *)0x0) ||
        (iVar15 = (*(piVar4->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(piVar4)
        , (char)iVar15 == '\0')) &&
       ((plVar12 == (long *)0x0 ||
        (cVar14 = (**(code **)(*plVar12 + 0x50))(plVar12), cVar14 == '\0')))) {
      if ((piVar4 != (ir_constant *)0x0) &&
         (iVar15 = (*(piVar4->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xc])
                             (piVar4), (char)iVar15 != '\0')) goto LAB_0017d6a3;
      if ((plVar12 == (long *)0x0) ||
         (cVar14 = (**(code **)(*plVar12 + 0x60))(plVar12), cVar14 == '\0')) {
        piVar25 = local_118[0];
        if (((local_118[0] != (ir_constant *)0x0) &&
            (local_118[1] != (ir_constant *)0x0 && (local_118[0]->value).u[0] == 0x10)) &&
           ((local_118[1]->value).u[0] == 0x10)) {
          oVar23.val = &ir_builder::logic_and
                                  ((ir_rvalue *)(local_118[0]->value).d[1],
                                   (ir_rvalue *)(local_118[1]->value).d[1])->super_ir_rvalue;
          local_160 = (ir_constant *)ir_builder::b2f(oVar23);
          goto LAB_0017e6b2;
        }
        if (plVar12 == (long *)0x0 && piVar4 != (ir_constant *)0x0) {
          reassociate_constant(this,(ir_expression *)ir1,0,local_118[1],in_R8);
        }
        if (piVar4 == (ir_constant *)0x0 && plVar12 != (long *)0x0) {
          reassociate_constant(this,(ir_expression *)ir1,1,piVar25,in_R8);
        }
        uVar30 = 0;
        lVar20 = 0;
        do {
          oVar23.val = *(ir_rvalue **)((long)&ir1->value + lVar20 * 8 + 8);
          lVar24 = *(long *)((long)&ir1->value + (ulong)(uint)((1 - (int)lVar20) * 8) + 8);
          if (*(int *)(lVar24 + 0x18) != 4) {
            lVar24 = 0;
          }
          iVar15 = 0x19;
          if (((((oVar23.val != (ir_rvalue *)0x0) &&
                (((oVar23.val)->super_ir_instruction).ir_type == ir_type_expression)) &&
               ((lVar24 != 0 &&
                ((*(int *)&oVar23.val[1].super_ir_instruction._vptr_ir_instruction == 4 &&
                 (*(int *)(lVar24 + 0x28) == 0x40)))))) &&
              (lVar24 = *(long *)(lVar24 + 0x30), lVar24 != 0)) &&
             ((*(int *)(lVar24 + 0x18) == 4 && (*(int *)(lVar24 + 0x28) == 0x6c)))) {
            lVar32 = -8;
            puVar31 = (undefined8 *)(lVar24 + 0x38);
            local_f8 = uVar30;
            do {
              lVar10 = *(long *)(lVar24 + 0x38 + lVar32);
              iVar15 = 0x1c;
              if ((((lVar10 != 0) && (*(int *)(lVar10 + 0x18) == 4)) &&
                  (*(int *)(lVar10 + 0x28) == 3)) &&
                 (((oVar17.val = (ir_rvalue *)*puVar31, oVar17.val != (ir_rvalue *)0x0 &&
                   (((oVar17.val)->super_ir_instruction).ir_type == ir_type_constant)) &&
                  (iVar16 = (*((oVar17.val)->super_ir_instruction)._vptr_ir_instruction[0xe])
                                      (0x3f000000,oVar17.val,0), (char)iVar16 != '\0')))) {
                cVar14 = (**(code **)(**(long **)(lVar10 + 0x30) + 0x28))
                                   (*(long **)(lVar10 + 0x30),
                                    oVar23.val[1].super_ir_instruction.super_exec_node.next,0x17);
                iVar15 = 0;
                if (cVar14 != '\0') {
                  a.val = *(ir_rvalue **)(lVar10 + 0x30);
                  oVar17.val = &ir_builder::mul(oVar23,oVar17)->super_ir_rvalue;
                  ir_builder::add(a,oVar17);
                  ir_builder::trunc((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
                  iVar15 = 1;
                  local_160 = extraout_RAX_00;
                }
              }
              if ((iVar15 != 0x1c) && (iVar15 != 0)) goto LAB_0017e607;
              puVar31 = puVar31 + -1;
              lVar32 = lVar32 + 8;
            } while (lVar32 == 0);
            iVar15 = 0x1a;
LAB_0017e607:
            uVar30 = local_f8;
            if (iVar15 == 0x1a) {
              iVar15 = 0;
            }
          }
          if ((iVar15 != 0x19) && (iVar15 != 0)) break;
          bVar37 = lVar20 == 0;
          uVar30 = CONCAT71((int7)(uVar30 >> 8),!bVar37);
          lVar20 = lVar20 + 1;
        } while (bVar37);
        bVar37 = (uVar30 & 1) == 0;
        goto LAB_0017e63b;
      }
      oVar23.val = (ir_rvalue *)(ir1->value).d[1];
      goto LAB_0017d6a7;
    }
    pgVar29 = (ir1->super_ir_rvalue).type;
    piVar25 = ir1;
    goto LAB_0017e145;
  case 0x76:
    if (((local_138 != (ir_constant *)0x0) &&
        (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])(),
        (char)iVar15 != '\0')) &&
       ((cVar14 = ((ir1->super_ir_rvalue).type)->field_0x4, cVar14 == '\x04' || (cVar14 == '\x02')))
       ) {
      local_160 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
      piVar19 = (ir_expression *)(ir1->value).u64[2];
      pgVar29 = (piVar19->super_ir_rvalue).type;
      iVar33 = ir_unop_rcp;
LAB_0017dce4:
      ir_expression::ir_expression
                ((ir_expression *)local_160,iVar33,pgVar29,&piVar19->super_ir_rvalue,
                 (ir_rvalue *)0x0,(ir_rvalue *)0x0,(ir_rvalue *)0x0);
      goto LAB_0017e6b2;
    }
    if (plStack_130 == (long *)0x0) break;
    cVar14 = (**(code **)(*plStack_130 + 0x58))();
LAB_0017e1a8:
    if (cVar14 != '\0') goto LAB_0017e1b0;
    break;
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
    uVar30 = 0;
    uVar36 = false;
    do {
      piVar4 = local_118[uVar30];
      bVar37 = true;
      if ((((piVar4 != (ir_constant *)0x0) && ((piVar4->value).u[0] == 0x6c)) &&
          ((&local_138)[uVar30 ^ 1] != (ir_constant *)0x0)) &&
         ((iVar15 = (*((&local_138)[uVar30 ^ 1]->super_ir_rvalue).super_ir_instruction.
                      _vptr_ir_instruction[10])(), (char)iVar15 != '\0' &&
          (*(long *)((piVar4->value).u64[1] + 0x20) == *(long *)((piVar4->value).u64[2] + 0x20)))))
      {
        piVar25 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
        iVar33 = (ir1->value).i[0];
        oVar23.val = *(ir_rvalue **)((long)&piVar4->value + 8);
        if (uVar30 == 0) {
          piVar19 = ir_builder::neg((ir_rvalue *)(piVar4->value).d[2]);
          ir_expression::ir_expression
                    ((ir_expression *)piVar25,iVar33,oVar23.val,&piVar19->super_ir_rvalue);
          bVar37 = false;
        }
        else {
          piVar19 = ir_builder::neg(oVar23);
          ir_expression::ir_expression
                    ((ir_expression *)piVar25,iVar33,&piVar19->super_ir_rvalue,
                     (ir_rvalue *)(piVar4->value).d[2]);
          bVar37 = false;
        }
      }
      if (!bVar37) break;
      uVar30 = uVar30 + 1;
      uVar36 = uVar30 != 1;
    } while (uVar30 == 1);
joined_r0x0017e6ad:
    local_160 = piVar25;
    if (!(bool)uVar36) goto LAB_0017e6b2;
    break;
  case 0x7e:
  case 0x7f:
    pgVar29 = ((ir_rvalue *)(ir1->value).u64[1])->type;
    if (((pgVar29->vector_elements == '\x01') &&
        (((*(uint *)&pgVar29->field_0x4 & 0xfe) < 0xe &&
         (pgVar29 = ((ir_rvalue *)(ir1->value).u64[2])->type, pgVar29->vector_elements == '\x01'))))
       && ((*(uint *)&pgVar29->field_0x4 & 0xfe) < 0xe)) {
      local_160 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
      ir_expression::ir_expression
                ((ir_expression *)local_160,(ir1->value).u[0] == ir_binop_all_equal ^ 0x7d,
                 (ir_rvalue *)(ir1->value).d[1],(ir_rvalue *)(ir1->value).d[2]);
      goto LAB_0017e6b2;
    }
    break;
  case 0x80:
  case 0x81:
    if ((local_138 == (ir_constant *)0x0) ||
       (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(),
       (char)iVar15 == '\0')) goto LAB_0017d6b1;
    goto LAB_0017e1b0;
  case 0x85:
    if ((local_138 != (ir_constant *)0x0) &&
       (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (local_138), (char)iVar15 != '\0')) goto LAB_0017db9e;
    plVar12 = plStack_130;
    if ((plStack_130 != (long *)0x0) &&
       (cVar14 = (**(code **)(*plStack_130 + 0x58))(plStack_130), cVar14 != '\0'))
    goto LAB_0017e1b0;
    if (((piVar4 == (ir_constant *)0x0) ||
        (iVar15 = (*(piVar4->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(piVar4)
        , (char)iVar15 == '\0')) &&
       ((plVar12 == (long *)0x0 ||
        (cVar14 = (**(code **)(*plVar12 + 0x50))(plVar12), cVar14 == '\0')))) {
      if (((local_118[0] != (ir_constant *)0x0) &&
          (local_118[1] != (ir_constant *)0x0 && (local_118[0]->value).u[0] == 1)) &&
         ((local_118[1]->value).u[0] == 1)) {
        oVar23.val = &ir_builder::logic_or
                                ((ir_rvalue *)(local_118[0]->value).d[1],
                                 (ir_rvalue *)(local_118[1]->value).d[1])->super_ir_rvalue;
        goto LAB_0017e18b;
      }
LAB_0017e195:
      iVar15 = (*(((ir_rvalue *)(ir1->value).u64[1])->super_ir_instruction)._vptr_ir_instruction[5])
                         ((ir_rvalue *)(ir1->value).u64[1],(ir_rvalue *)(ir1->value).d[2],0x17);
      cVar14 = (char)iVar15;
      goto LAB_0017e1a8;
    }
    goto LAB_0017e13d;
  case 0x86:
    if ((local_138 != (ir_constant *)0x0) &&
       (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (local_138), (char)iVar15 != '\0')) goto LAB_0017db9e;
    plVar12 = plStack_130;
    if ((plStack_130 == (long *)0x0) ||
       (cVar14 = (**(code **)(*plStack_130 + 0x50))(plStack_130), cVar14 == '\0')) {
      if ((piVar4 == (ir_constant *)0x0) ||
         (iVar15 = (*(piVar4->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                             (piVar4), (char)iVar15 == '\0')) {
        if ((plVar12 == (long *)0x0) ||
           (cVar14 = (**(code **)(*plVar12 + 0x58))(plVar12), cVar14 == '\0')) {
          iVar15 = (*(((ir_rvalue *)(ir1->value).u64[1])->super_ir_instruction)._vptr_ir_instruction
                     [5])((ir_rvalue *)(ir1->value).u64[1],(ir_rvalue *)(ir1->value).d[2],0x17);
          if ((char)iVar15 != '\0') goto LAB_0017e13d;
          break;
        }
        oVar23.val = (ir_rvalue *)(ir1->value).d[1];
      }
      else {
        oVar23.val = (ir_rvalue *)(ir1->value).d[2];
      }
LAB_0017e18b:
      local_160 = (ir_constant *)ir_builder::logic_not(oVar23);
      goto LAB_0017e6b2;
    }
    goto LAB_0017e1b0;
  case 0x87:
    if ((local_138 != (ir_constant *)0x0) &&
       (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (local_138), (char)iVar15 != '\0')) goto LAB_0017db9e;
    plVar12 = plStack_130;
    if ((plStack_130 == (long *)0x0) ||
       (cVar14 = (**(code **)(*plStack_130 + 0x50))(plStack_130), cVar14 == '\0')) {
      if (((piVar4 != (ir_constant *)0x0) &&
          (iVar15 = (*(piVar4->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                              (piVar4), (char)iVar15 != '\0')) ||
         ((plVar12 != (long *)0x0 &&
          (cVar14 = (**(code **)(*plVar12 + 0x58))(plVar12), cVar14 != '\0')))) {
        local_b8.u64[0] = 0x101010101010101;
        local_b8.u64[1] = 0x101010101010101;
        local_160 = (ir_constant *)exec_node::operator_new(0xb0,this->mem_ctx);
        ir_constant::ir_constant(local_160,(ir1->super_ir_rvalue).type,&local_b8);
        goto LAB_0017e6b2;
      }
      if (((local_118[0] == (ir_constant *)0x0) ||
          (local_118[1] == (ir_constant *)0x0 || (local_118[0]->value).u[0] != 1)) ||
         ((local_118[1]->value).u[0] != 1)) goto LAB_0017e195;
      oVar23.val = &ir_builder::logic_and
                              ((ir_rvalue *)(local_118[0]->value).d[1],
                               (ir_rvalue *)(local_118[1]->value).d[1])->super_ir_rvalue;
      goto LAB_0017e18b;
    }
    goto LAB_0017e1b0;
  case 0x88:
    if (((local_138 == (ir_constant *)0x0) ||
        (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(),
        (char)iVar15 == '\0')) &&
       ((plStack_130 == (long *)0x0 ||
        (cVar14 = (**(code **)(*plStack_130 + 0x50))(), cVar14 == '\0')))) {
      lVar20 = 0;
LAB_0017d40a:
      piVar4 = (&local_138)[lVar20];
      if (piVar4 == (ir_constant *)0x0) goto code_r0x0017d418;
      local_b8.d[0] = 0.0;
      local_b8.d[1] = 0.0;
      bVar3 = ((piVar4->super_ir_rvalue).type)->vector_elements;
      uVar30 = 0;
      uVar35 = 0;
      if (bVar3 != 0) {
        uVar34 = 0;
        do {
          iVar15 = (*(piVar4->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                             (piVar4);
          if ((char)iVar15 == '\0') {
            *(uint *)((long)&local_b8 + uVar30 * 4) = uVar34;
            uVar30 = (ulong)((int)uVar30 + 1);
          }
          uVar35 = (uint)uVar30;
          uVar34 = uVar34 + 1;
          bVar3 = ((piVar4->super_ir_rvalue).type)->vector_elements;
        } while (uVar34 < bVar3);
      }
      uVar36 = bVar3 <= uVar35;
      if (!(bool)uVar36) {
        iVar15 = 0x88;
        if (uVar35 == 1) {
          iVar15 = 0x73;
        }
        piVar25 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
        pgVar29 = (ir1->super_ir_rvalue).type;
        this_00 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
        ir_swizzle::ir_swizzle(this_00,(ir_rvalue *)(ir1->value).d[1],local_b8.u,uVar35);
        this_01 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
        ir_swizzle::ir_swizzle(this_01,(ir_rvalue *)(ir1->value).d[2],local_b8.u,uVar35);
        ir_expression::ir_expression
                  ((ir_expression *)piVar25,iVar15,pgVar29,(ir_rvalue *)this_00,(ir_rvalue *)this_01
                   ,(ir_rvalue *)0x0,(ir_rvalue *)0x0);
      }
      goto joined_r0x0017e6ad;
    }
LAB_0017e13d:
    pgVar29 = (ir1->super_ir_rvalue).type;
    piVar25 = (ir_constant *)this->mem_ctx;
LAB_0017e145:
    local_160 = ir_constant::zero(piVar25,pgVar29);
    goto LAB_0017e6b2;
  case 0x89:
  case 0x8a:
    if ((((ir1->super_ir_rvalue).type)->field_0x4 == '\x02') && (this->options->EmitNoSat == '\0'))
    {
      uVar30 = 0;
      do {
        piVar4 = local_118[uVar30];
        piVar5 = *(ir_constant **)((long)&local_138 + (ulong)(uint)((1 - (int)uVar30) * 8));
        uVar27 = uVar30;
        iVar15 = 0x2b;
        if ((piVar5 != (ir_constant *)0x0 && piVar4 != (ir_constant *)0x0) &&
           ((piVar4->value).u[0] == ((ir1->value).u[0] != ir_binop_max) + 0x89)) {
          if (((piVar4->value).u64[1] == 0) || (*(int *)((piVar4->value).u64[1] + 0x18) != 3)) {
            iVar15 = 0x29;
            if (((piVar4->value).u64[2] == 0) || (*(int *)((piVar4->value).u64[2] + 0x18) != 3))
            goto LAB_0017d2b7;
          }
          local_f8 = uVar30;
          lVar20 = 0;
          do {
            oVar23.val = *(ir_rvalue **)
                          ((long)&piVar4->value + (ulong)(uint)((1 - (int)lVar20) * 8) + 8);
            iVar15 = 0x2e;
            if (((ir_constant *)oVar23.val == (ir_constant *)0x0) ||
               ((((ir_rvalue *)&(oVar23.val)->super_ir_instruction)->super_ir_instruction).ir_type
                != ir_type_constant)) goto LAB_0017d276;
            oVar17.val = *(ir_rvalue **)((long)&piVar4->value + lVar20 * 8 + 8);
            if ((((ir1->value).u[0] == ir_binop_min) &&
                ((iVar15 = (*(((ir_rvalue *)&(oVar23.val)->super_ir_instruction)->
                             super_ir_instruction)._vptr_ir_instruction[10])(oVar23.val),
                 (char)iVar15 != '\0' &&
                 (iVar15 = (*(piVar5->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction
                             [0xb])(), (char)iVar15 != '\0')))) ||
               (((ir1->value).u[0] == ir_binop_max &&
                ((iVar15 = (*(((ir_rvalue *)&(oVar23.val)->super_ir_instruction)->
                             super_ir_instruction)._vptr_ir_instruction[0xb])(oVar23.val),
                 (char)iVar15 != '\0' &&
                 (iVar15 = (*(piVar5->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10]
                           )(), (char)iVar15 != '\0')))))) {
LAB_0017d268:
              piVar25 = (ir_constant *)ir_builder::saturate(oVar17);
              iVar15 = 1;
            }
            else {
              if (((ir1->value).u[0] != ir_binop_min) ||
                 (iVar15 = (*(((ir_rvalue *)&(oVar23.val)->super_ir_instruction)->
                             super_ir_instruction)._vptr_ir_instruction[10])(oVar23.val),
                 (char)iVar15 == '\0')) goto LAB_0017d078;
              pgVar29 = (piVar5->super_ir_rvalue).type;
              if (pgVar29->field_0x4 != '\x02') goto LAB_0017e7dd;
              uVar2 = pgVar29->vector_elements;
              if ((uVar2 == '\x01') || ((uVar2 != '\0' && (pgVar29->matrix_columns == '\x01')))) {
                if (uVar2 == '\0') {
                  uVar35 = 0;
                  bVar3 = 0;
                }
                else {
                  uVar34 = 0;
                  uVar35 = 0;
                  do {
                    fVar39 = ir_constant::get_float_component(piVar5,uVar34);
                    uVar35 = uVar35 + (fVar39 < 1.0);
                    uVar34 = uVar34 + 1;
                    bVar3 = ((piVar5->super_ir_rvalue).type)->vector_elements;
                  } while (uVar34 < bVar3);
                }
                if (uVar35 != bVar3) goto LAB_0017d078;
                iVar33 = ir_binop_min;
                oVar23.val = &piVar5->super_ir_rvalue;
LAB_0017d260:
                oVar17.val = &ir_builder::expr(iVar33,oVar17,oVar23)->super_ir_rvalue;
                goto LAB_0017d268;
              }
LAB_0017d078:
              if ((ir1->value).u[0] == ir_binop_max) {
                pgVar29 = ((ir_rvalue *)&(oVar23.val)->super_ir_instruction)->type;
                if (pgVar29->field_0x4 != '\x02') {
LAB_0017e7dd:
                  __assert_fail("ir->type->is_float()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                                ,0x94,"bool is_less_than_one(ir_constant *)");
                }
                uVar2 = pgVar29->vector_elements;
                if ((uVar2 == '\x01') || ((uVar2 != '\0' && (pgVar29->matrix_columns == '\x01')))) {
                  if (uVar2 == '\0') {
                    uVar35 = 0;
                    bVar3 = 0;
                  }
                  else {
                    uVar34 = 0;
                    uVar35 = 0;
                    do {
                      fVar39 = ir_constant::get_float_component((ir_constant *)oVar23.val,uVar34);
                      uVar35 = uVar35 + (fVar39 < 1.0);
                      uVar34 = uVar34 + 1;
                      bVar3 = ((ir_rvalue *)&(oVar23.val)->super_ir_instruction)->type->
                              vector_elements;
                    } while (uVar34 < bVar3);
                  }
                  if ((uVar35 == bVar3) &&
                     (iVar15 = (*(piVar5->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction
                                 [10])(), (char)iVar15 != '\0')) {
                    iVar33 = ir_binop_min;
                    goto LAB_0017d260;
                  }
                }
              }
              if (((ir1->value).u[0] == ir_binop_max) &&
                 (iVar15 = (*(((ir_rvalue *)&(oVar23.val)->super_ir_instruction)->
                             super_ir_instruction)._vptr_ir_instruction[0xb])(oVar23.val),
                 (char)iVar15 != '\0')) {
                pgVar29 = (piVar5->super_ir_rvalue).type;
                if (pgVar29->field_0x4 != '\x02') goto LAB_0017e7fc;
                uVar2 = pgVar29->vector_elements;
                if ((uVar2 == '\x01') || ((uVar2 != '\0' && (pgVar29->matrix_columns == '\x01')))) {
                  if (uVar2 == '\0') {
                    uVar35 = 0;
                    bVar3 = 0;
                  }
                  else {
                    uVar34 = 0;
                    uVar35 = 0;
                    do {
                      fVar39 = ir_constant::get_float_component(piVar5,uVar34);
                      uVar35 = uVar35 + (0.0 < fVar39);
                      uVar34 = uVar34 + 1;
                      bVar3 = ((piVar5->super_ir_rvalue).type)->vector_elements;
                    } while (uVar34 < bVar3);
                  }
                  if (uVar35 == bVar3) {
                    iVar33 = ir_binop_max;
                    oVar23.val = &piVar5->super_ir_rvalue;
                    goto LAB_0017d260;
                  }
                }
              }
              iVar15 = 0;
              if ((ir1->value).u[0] == ir_binop_min) {
                pgVar29 = ((ir_rvalue *)&(oVar23.val)->super_ir_instruction)->type;
                if (pgVar29->field_0x4 != '\x02') {
LAB_0017e7fc:
                  __assert_fail("ir->type->is_float()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                                ,0xa5,"bool is_greater_than_zero(ir_constant *)");
                }
                bVar3 = pgVar29->vector_elements;
                if ((bVar3 == 1) ||
                   ((bVar3 != 0 && (iVar15 = 0, pgVar29->matrix_columns == '\x01')))) {
                  iVar15 = 0;
                  uVar35 = 0;
                  if (bVar3 != 0) {
                    uVar34 = 0;
                    uVar35 = 0;
                    do {
                      fVar39 = ir_constant::get_float_component((ir_constant *)oVar23.val,uVar34);
                      uVar35 = uVar35 + (0.0 < fVar39);
                      uVar34 = uVar34 + 1;
                      bVar3 = ((ir_rvalue *)&(oVar23.val)->super_ir_instruction)->type->
                              vector_elements;
                    } while (uVar34 < bVar3);
                  }
                  if ((uVar35 == bVar3) &&
                     (iVar16 = (*(piVar5->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction
                                 [0xb])(), iVar15 = 0, (char)iVar16 != '\0')) {
                    iVar33 = ir_binop_max;
                    goto LAB_0017d260;
                  }
                }
              }
            }
LAB_0017d276:
            if ((iVar15 != 0x2e) && (iVar15 != 0)) goto LAB_0017d2a5;
            bVar37 = lVar20 == 0;
            lVar20 = lVar20 + 1;
          } while (bVar37);
          iVar15 = 0x2c;
LAB_0017d2a5:
          uVar27 = local_f8;
          if (iVar15 == 0x2c) {
            iVar15 = 0;
          }
        }
LAB_0017d2b7:
        if ((iVar15 != 0x2b) && (iVar15 != 0)) goto LAB_0017d2d8;
        uVar30 = uVar27 + 1;
      } while (uVar27 == 0);
      iVar15 = 0x29;
LAB_0017d2d8:
      local_160 = piVar25;
      if (iVar15 != 0x29) goto LAB_0017e6b2;
    }
    break;
  case 0x8b:
    if ((local_138 != (ir_constant *)0x0) &&
       (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (local_138), local_160 = piVar4, (char)iVar15 != '\0'))
    goto LAB_0017e6b2;
    plVar12 = plStack_130;
    if ((plStack_130 != (long *)0x0) &&
       (cVar14 = (**(code **)(*plStack_130 + 0x58))(plStack_130), cVar14 != '\0'))
    goto LAB_0017e1b0;
    if ((piVar4 != (ir_constant *)0x0) &&
       (iVar15 = (*(piVar4->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xe])
                           (0x40000000,piVar4,2), (char)iVar15 != '\0')) {
      local_160 = (ir_constant *)ir_builder::expr(ir_unop_exp2,(ir_rvalue *)(ir1->value).d[2]);
      goto LAB_0017e6b2;
    }
    if (plVar12 != (long *)0x0) {
      cVar14 = (**(code **)(*plVar12 + 0x70))(0x40000000,plVar12,2);
      if (cVar14 == '\0') {
        cVar14 = (**(code **)(*plVar12 + 0x70))(0x40800000,plVar12,4);
        if (cVar14 == '\0') break;
        piVar21 = (ir_variable *)exec_node::operator_new(0x90,ir1);
        ir_variable::ir_variable
                  (piVar21,((ir_rvalue *)(ir1->value).u64[2])->type,"x",ir_var_temporary);
        piVar9 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.base_ir;
        peVar1 = &(piVar21->super_ir_instruction).super_exec_node;
        (piVar21->super_ir_instruction).super_exec_node.next = &piVar9->super_exec_node;
        (piVar21->super_ir_instruction).super_exec_node.prev = (piVar9->super_exec_node).prev;
        ((piVar9->super_exec_node).prev)->next = peVar1;
        (piVar9->super_exec_node).prev = peVar1;
        ir_builder::deref::deref((deref *)local_b8.d,piVar21);
        piVar22 = ir_builder::assign((deref)local_b8.d[0],(ir_rvalue *)(ir1->value).d[1]);
        if (piVar22 != (ir_assignment *)0x0) {
          piVar22 = (ir_assignment *)&(piVar22->super_ir_instruction).super_exec_node;
        }
        (piVar22->super_ir_instruction)._vptr_ir_instruction =
             (_func_int **)&piVar9->super_exec_node;
        (piVar22->super_ir_instruction).super_exec_node.next = (piVar9->super_exec_node).prev;
        ((piVar9->super_exec_node).prev)->next = (exec_node *)piVar22;
        (piVar9->super_exec_node).prev = (exec_node *)piVar22;
        this_02 = (ir_variable *)exec_node::operator_new(0x90,ir1);
        ir_variable::ir_variable
                  (this_02,((ir_rvalue *)(ir1->value).u64[2])->type,"squared",ir_var_temporary);
        piVar9 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.base_ir;
        peVar1 = &(this_02->super_ir_instruction).super_exec_node;
        (this_02->super_ir_instruction).super_exec_node.next = &piVar9->super_exec_node;
        (this_02->super_ir_instruction).super_exec_node.prev = (piVar9->super_exec_node).prev;
        ((piVar9->super_exec_node).prev)->next = peVar1;
        (piVar9->super_exec_node).prev = peVar1;
        ir_builder::deref::deref((deref *)&local_e8,this_02);
        ir_builder::operand::operand(&local_f0,piVar21);
        ir_builder::operand::operand(&local_c0,piVar21);
        oVar23.val = &ir_builder::mul(local_f0,local_c0)->super_ir_rvalue;
        piVar22 = ir_builder::assign((deref)local_e8.val,oVar23);
        if (piVar22 != (ir_assignment *)0x0) {
          piVar22 = (ir_assignment *)&(piVar22->super_ir_instruction).super_exec_node;
        }
        (piVar22->super_ir_instruction)._vptr_ir_instruction =
             (_func_int **)&piVar9->super_exec_node;
        (piVar22->super_ir_instruction).super_exec_node.next = (piVar9->super_exec_node).prev;
        ((piVar9->super_exec_node).prev)->next = (exec_node *)piVar22;
        (piVar9->super_exec_node).prev = (exec_node *)piVar22;
        ir_builder::operand::operand(&local_c8,this_02);
        this_03 = &local_d0;
        ir_builder::operand::operand(this_03,this_02);
        local_e8.val = local_c8.val;
      }
      else {
        piVar21 = (ir_variable *)exec_node::operator_new(0x90,ir1);
        ir_variable::ir_variable
                  (piVar21,((ir_rvalue *)(ir1->value).u64[2])->type,"x",ir_var_temporary);
        piVar9 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.base_ir;
        peVar1 = &(piVar21->super_ir_instruction).super_exec_node;
        (piVar21->super_ir_instruction).super_exec_node.next = &piVar9->super_exec_node;
        (piVar21->super_ir_instruction).super_exec_node.prev = (piVar9->super_exec_node).prev;
        ((piVar9->super_exec_node).prev)->next = peVar1;
        (piVar9->super_exec_node).prev = peVar1;
        ir_builder::deref::deref((deref *)local_b8.d,piVar21);
        piVar22 = ir_builder::assign((deref)local_b8.d[0],(ir_rvalue *)(ir1->value).d[1]);
        if (piVar22 != (ir_assignment *)0x0) {
          piVar22 = (ir_assignment *)&(piVar22->super_ir_instruction).super_exec_node;
        }
        (piVar22->super_ir_instruction)._vptr_ir_instruction =
             (_func_int **)&piVar9->super_exec_node;
        (piVar22->super_ir_instruction).super_exec_node.next = (piVar9->super_exec_node).prev;
        ((piVar9->super_exec_node).prev)->next = (exec_node *)piVar22;
        (piVar9->super_exec_node).prev = (exec_node *)piVar22;
        ir_builder::operand::operand(&local_e8,piVar21);
        this_03 = &local_f0;
        ir_builder::operand::operand(this_03,piVar21);
      }
      oVar23.val = this_03->val;
      goto LAB_0017e7b1;
    }
    break;
  case 0x92:
    if (((local_138 != (ir_constant *)0x0) &&
        (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                            (local_138), (char)iVar15 != '\0')) ||
       ((plVar12 = plStack_130, plStack_130 != (long *)0x0 &&
        (cVar14 = (**(code **)(*plStack_130 + 0x50))(plStack_130), cVar14 != '\0')))) {
LAB_0017da46:
      local_160 = (ir_constant *)(ir1->value).u64[3];
      goto LAB_0017e6b2;
    }
    if ((local_128 == (long *)0x0) || (cVar14 = (**(code **)(*local_128 + 0x50))(), cVar14 == '\0'))
    {
      if ((piVar4 == (ir_constant *)0x0) ||
         (iVar15 = (*(piVar4->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                             (piVar4), (char)iVar15 == '\0')) {
        if ((plVar12 == (long *)0x0) ||
           (cVar14 = (**(code **)(*plVar12 + 0x58))(plVar12), cVar14 == '\0')) break;
        oVar23.val = (ir_rvalue *)(ir1->value).d[1];
      }
      else {
        oVar23.val = (ir_rvalue *)(ir1->value).d[2];
      }
      local_160 = (ir_constant *)ir_builder::add(oVar23,(ir_rvalue *)(ir1->value).d[3]);
      goto LAB_0017e6b2;
    }
    local_e8.val = (ir_rvalue *)(ir1->value).d[1];
    oVar23.val = (ir_rvalue *)(ir1->value).d[2];
LAB_0017e7b1:
    local_160 = (ir_constant *)ir_builder::mul(local_e8,oVar23);
    goto LAB_0017e6b2;
  case 0x93:
    if (local_128 != (long *)0x0) {
      cVar14 = (**(code **)(*local_128 + 0x50))(local_128);
      if (cVar14 != '\0') goto LAB_0017e1b0;
      cVar14 = (**(code **)(*plVar12 + 0x58))(plVar12);
      if (cVar14 != '\0') goto LAB_0017db9e;
    }
    iVar15 = (*(((ir_rvalue *)(ir1->value).u64[1])->super_ir_instruction)._vptr_ir_instruction[5])
                       ((ir_rvalue *)(ir1->value).u64[1],(ir_rvalue *)(ir1->value).d[2],0x17);
    if ((char)iVar15 == '\0') {
      if ((local_138 == (ir_constant *)0x0) ||
         (iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(),
         (char)iVar15 == '\0')) {
        if ((plStack_130 == (long *)0x0) ||
           (cVar14 = (**(code **)(*plStack_130 + 0x50))(), cVar14 == '\0')) break;
        uVar35 = (uint)((ir_rvalue *)(ir1->value).u64[3])->type->vector_elements;
        cVar14 = ((ir1->super_ir_rvalue).type)->field_0x4;
        if (cVar14 == '\x02') {
          oVar23.val = (ir_rvalue *)exec_node::operator_new(0xb0,this->mem_ctx);
          ir_constant::ir_constant((ir_constant *)oVar23.val,1.0,uVar35);
        }
        else if (cVar14 == '\x04') {
          oVar23.val = (ir_rvalue *)exec_node::operator_new(0xb0,this->mem_ctx);
          ir_constant::ir_constant((ir_constant *)oVar23.val,1.0,uVar35);
        }
        else {
          if (cVar14 != '\x03') {
            __assert_fail("!\"unexpected type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                          ,0x3e6,
                          "ir_rvalue *(anonymous namespace)::ir_algebraic_visitor::handle_expression(ir_expression *)"
                         );
          }
          oVar23.val = (ir_rvalue *)exec_node::operator_new(0xb0,this->mem_ctx);
          ir_constant::ir_constant((ir_constant *)oVar23.val,(float16_t)0x3c00,uVar35);
        }
        piVar26 = (ir_rvalue *)(ir1->value).d[1];
        oVar17.val = &ir_builder::neg((ir_rvalue *)(ir1->value).d[3])->super_ir_rvalue;
        oVar23.val = &ir_builder::add(oVar23,oVar17)->super_ir_rvalue;
        local_e8.val = piVar26;
      }
      else {
        oVar23.val = (ir_rvalue *)(ir1->value).d[3];
        local_e8.val = (ir_rvalue *)(ir1->value).d[2];
      }
      goto LAB_0017e7b1;
    }
LAB_0017e1b0:
    local_160 = (ir_constant *)(ir1->value).u64[1];
    goto LAB_0017e6b2;
  case 0x94:
    if (local_138 != (ir_constant *)0x0) {
      iVar15 = (*(local_138->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                         (local_138);
      if ((char)iVar15 != '\0') goto LAB_0017db9e;
      iVar15 = (*(piVar4->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(piVar4);
      if ((char)iVar15 != '\0') goto LAB_0017da46;
    }
    break;
  default:
    switch((ir1->value).u[0]) {
    case 0:
      if ((local_118[0] != (ir_constant *)0x0) && ((local_118[0]->value).u[0] == 0)) {
LAB_0017ddc6:
        local_160 = (ir_constant *)(local_118[0]->value).u64[1];
        goto LAB_0017e6b2;
      }
      break;
    case 1:
      if (local_118[0] == (ir_constant *)0x0) {
        uVar36 = true;
        goto joined_r0x0017e6ad;
      }
      uVar36 = true;
      switch((local_118[0]->value).u[0]) {
      case 0x7a:
        iVar15 = 0x7b;
        break;
      case 0x7b:
        iVar15 = 0x7a;
        break;
      case 0x7c:
        iVar15 = 0x7d;
        break;
      case 0x7d:
        iVar15 = 0x7c;
        break;
      case 0x7e:
        iVar15 = 0x7f;
        break;
      case 0x7f:
        iVar15 = 0x7e;
        break;
      default:
        iVar15 = 1;
        bVar37 = true;
        goto LAB_0017e66c;
      }
      bVar37 = false;
LAB_0017e66c:
      if (!bVar37) {
        piVar25 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
        uVar36 = false;
        ir_expression::ir_expression
                  ((ir_expression *)piVar25,iVar15,(ir1->super_ir_rvalue).type,
                   (ir_rvalue *)(piVar5->value).d[1],(ir_rvalue *)(piVar5->value).d[2],
                   (ir_rvalue *)0x0,(ir_rvalue *)0x0);
      }
      goto joined_r0x0017e6ad;
    case 2:
      if ((local_118[0] != (ir_constant *)0x0) && ((local_118[0]->value).u[0] == 2))
      goto LAB_0017ddc6;
      break;
    case 3:
      if ((local_118[0] != (ir_constant *)0x0) && (((local_118[0]->value).u[0] & 0xfffffffe) == 2))
      {
        iVar15 = ir_builder::abs((int)(local_118[0]->value).i64[1]);
        local_160 = (ir_constant *)CONCAT44(extraout_var_00,iVar15);
        goto LAB_0017e6b2;
      }
      break;
    case 5:
      if (local_118[0] != (ir_constant *)0x0) {
        switch((local_118[0]->value).u[0]) {
        case 5:
switchD_0017dcab_caseD_5:
          local_160 = (ir_constant *)(local_118[0]->value).u64[1];
          break;
        case 6:
          ir_builder::sqrt((double)CONCAT44(uVar40,uVar38));
          local_160 = extraout_RAX;
          break;
        case 7:
          local_160 = (ir_constant *)ir_builder::rsq((ir_rvalue *)(local_118[0]->value).d[1]);
          break;
        case 8:
        case 10:
          local_160 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
          iVar33 = (piVar5->value).i[0];
          pgVar29 = (ir1->super_ir_rvalue).type;
          piVar19 = ir_builder::neg((ir_rvalue *)(piVar5->value).d[1]);
          goto LAB_0017dce4;
        default:
          goto switchD_0017cd1c_caseD_5e;
        }
        goto LAB_0017e6b2;
      }
      break;
    case 8:
      if ((local_118[0] != (ir_constant *)0x0) && ((local_118[0]->value).u[0] == 9))
      goto LAB_0017ddc6;
      break;
    case 9:
      if ((local_118[0] != (ir_constant *)0x0) && ((local_118[0]->value).u[0] == 8))
      goto LAB_0017ddc6;
      break;
    case 10:
      if (local_118[0] != (ir_constant *)0x0) {
        if ((local_118[0]->value).u[0] == 0xb) goto switchD_0017dcab_caseD_5;
        if (((local_118[0]->value).u[0] == 0x73) && (this->options->EmitNoPow == '\0')) {
          uVar30 = 0;
          bVar37 = false;
          do {
            lVar20 = *(long *)((long)&piVar5->value + uVar30 * 8 + 8);
            bVar11 = true;
            if (((lVar20 != 0) && (*(int *)(lVar20 + 0x18) == 4)) &&
               (*(int *)(lVar20 + 0x28) == 0xb)) {
              local_160 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
              bVar11 = false;
              ir_expression::ir_expression
                        ((ir_expression *)local_160,0x8b,(ir1->super_ir_rvalue).type,
                         *(ir_rvalue **)(lVar20 + 0x30),
                         *(ir_rvalue **)((long)&piVar5->value + (uVar30 ^ 1) * 8 + 8),
                         (ir_rvalue *)0x0,(ir_rvalue *)0x0);
            }
            if (!bVar11) break;
            uVar30 = uVar30 + 1;
            bVar37 = uVar30 != 1;
          } while (uVar30 == 1);
          bVar37 = !bVar37;
LAB_0017e63b:
          if (bVar37) goto LAB_0017e6b2;
        }
      }
      break;
    case 0xb:
      if ((local_118[0] != (ir_constant *)0x0) && ((local_118[0]->value).u[0] == 10))
      goto LAB_0017ddc6;
      break;
    case 0xc:
    case 0xd:
      if ((local_118[0] != (ir_constant *)0x0) && ((local_118[0]->value).u[0] == 0x3e)) {
        local_160 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
        iVar33 = (ir1->value).i[0];
        pgVar29 = (ir1->super_ir_rvalue).type;
        piVar19 = (ir_expression *)(piVar5->value).d[1];
        goto LAB_0017dce4;
      }
    }
  }
switchD_0017cd1c_caseD_5e:
  local_160 = ir1;
LAB_0017e6b2:
  ppiVar13 = local_d8;
  if (local_160 != (ir_constant *)*local_d8) {
    pgVar29 = (ir1->super_ir_rvalue).type;
    piVar25 = local_160;
    if (((1 < pgVar29->vector_elements) && (pgVar29->matrix_columns == '\x01')) &&
       (((*(uint *)&pgVar29->field_0x4 & 0xfc) < 0xc &&
        ((pgVar29 = (local_160->super_ir_rvalue).type, pgVar29->vector_elements == '\x01' &&
         ((*(uint *)&pgVar29->field_0x4 & 0xfe) < 0xe)))))) {
      piVar25 = (ir_constant *)exec_node::operator_new(0x38,this->mem_ctx);
      ir_swizzle::ir_swizzle
                ((ir_swizzle *)piVar25,&local_160->super_ir_rvalue,0,0,0,0,
                 (uint)((ir1->super_ir_rvalue).type)->vector_elements);
    }
    *ppiVar13 = &piVar25->super_ir_rvalue;
    this->progress = true;
  }
  return;
code_r0x0017d418:
  lVar20 = lVar20 + 1;
  if (lVar20 != 1) goto code_r0x0017d421;
  goto LAB_0017d40a;
code_r0x0017d421:
  uVar36 = true;
  goto joined_r0x0017e6ad;
}

Assistant:

void
ir_algebraic_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   if (!*rvalue)
      return;

   ir_expression *expr = (*rvalue)->as_expression();
   if (!expr || expr->operation == ir_quadop_vector)
      return;

   ir_rvalue *new_rvalue = handle_expression(expr);
   if (new_rvalue == *rvalue)
      return;

   /* If the expr used to be some vec OP scalar returning a vector, and the
    * optimization gave us back a scalar, we still need to turn it into a
    * vector.
    */
   *rvalue = swizzle_if_required(expr, new_rvalue);

   this->progress = true;
}